

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

void parameterize_category_list
               (embryonic_category_reference *ctgs,wchar_t n,wchar_t ind,ui_entry *entry)

{
  category_reference *pcVar1;
  wchar_t local_28;
  wchar_t local_24;
  wchar_t i;
  ui_entry *entry_local;
  wchar_t ind_local;
  wchar_t n_local;
  embryonic_category_reference *ctgs_local;
  
  pcVar1 = (category_reference *)mem_alloc((long)n << 4);
  entry->categories = pcVar1;
  entry->n_category = n;
  entry->nalloc_category = n;
  for (local_24 = L'\0'; local_24 < n; local_24 = local_24 + L'\x01') {
    entry->categories[local_24].name = ctgs[local_24].name;
    if ((ctgs[local_24].priority_set & 1U) == 0) {
      entry->categories[local_24].priority = L'\0';
      entry->categories[local_24].priority_set = false;
    }
    else {
      if (ctgs[local_24].psource_index < L'\x01') {
        local_28 = ctgs[local_24].priority;
      }
      else {
        local_28 = (*priority_schemes[ctgs[local_24].psource_index].priority)(ind);
      }
      entry->categories[local_24].priority = local_28;
      entry->categories[local_24].priority_set = true;
    }
  }
  return;
}

Assistant:

static void parameterize_category_list(
	const struct embryonic_category_reference *ctgs, int n, int ind,
	struct ui_entry *entry)
{
	int i;

	entry->categories = mem_alloc(n * sizeof(*entry->categories));
	entry->n_category = n;
	entry->nalloc_category = n;

	for (i = 0; i < n; ++i) {
		entry->categories[i].name = ctgs[i].name;
		if (ctgs[i].priority_set) {
			entry->categories[i].priority =
				(ctgs[i].psource_index > 0) ?
				(*priority_schemes[ctgs[i].psource_index].priority)(ind) :
				ctgs[i].priority;
			entry->categories[i].priority_set = true;
		} else {
			entry->categories[i].priority = 0;
			entry->categories[i].priority_set = false;
		}
	}
}